

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O3

void __thiscall
duckdb::NestedLoopJoinGlobalState::NestedLoopJoinGlobalState
          (NestedLoopJoinGlobalState *this,ClientContext *context,PhysicalNestedLoopJoin *op)

{
  bool enabled_p;
  const_reference pvVar1;
  vector<duckdb::LogicalType,_true> vStack_58;
  vector<duckdb::LogicalType,_true> local_40;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__NestedLoopJoinGlobalState_0246b288;
  (this->nj_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->nj_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->nj_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->nj_lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->nj_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  pvVar1 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.children,1);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_40,
             &(pvVar1->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ColumnDataCollection::ColumnDataCollection
            (&this->right_payload_data,context,&local_40,BUFFER_MANAGER_ALLOCATOR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_40);
  PhysicalNestedLoopJoin::GetJoinTypes(&vStack_58,op);
  ColumnDataCollection::ColumnDataCollection
            (&this->right_condition_data,context,&vStack_58,BUFFER_MANAGER_ALLOCATOR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&vStack_58);
  (this->has_null)._M_base._M_i = false;
  enabled_p = PropagatesBuildSide((op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                                  super_CachingPhysicalOperator.field_0x81);
  OuterJoinMarker::OuterJoinMarker(&this->right_outer,enabled_p);
  return;
}

Assistant:

explicit NestedLoopJoinGlobalState(ClientContext &context, const PhysicalNestedLoopJoin &op)
	    : right_payload_data(context, op.children[1].get().GetTypes()),
	      right_condition_data(context, op.GetJoinTypes()), has_null(false),
	      right_outer(PropagatesBuildSide(op.join_type)) {
	}